

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

void __thiscall
Frame::TracePointers(Frame *this,function<void_(std::tuple<const_char_*,_Sexp_**>)> *func)

{
  pointer ptVar1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *pvVar2;
  pointer ppSVar3;
  tuple<const_char_*,_Sexp_**> *it;
  pointer ptVar4;
  Sexp **root;
  _Head_base<1UL,_Sexp_**,_false> _Var5;
  tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*> *vec;
  pointer ptVar6;
  tuple<const_char_*,_Sexp_**> local_58;
  tuple<const_char_*,_Sexp_**> local_48;
  pointer local_38;
  
  ptVar1 = (this->roots).
           super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar4 = (this->roots).
                super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    local_58.super__Tuple_impl<0UL,_const_char_*,_Sexp_**>.super__Tuple_impl<1UL,_Sexp_**>.
    super__Head_base<1UL,_Sexp_**,_false>._M_head_impl =
         (_Head_base<1UL,_Sexp_**,_false>)
         (ptVar4->super__Tuple_impl<0UL,_const_char_*,_Sexp_**>).super__Tuple_impl<1UL,_Sexp_**>.
         super__Head_base<1UL,_Sexp_**,_false>._M_head_impl;
    local_58.super__Tuple_impl<0UL,_const_char_*,_Sexp_**>.
    super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
         (ptVar4->super__Tuple_impl<0UL,_const_char_*,_Sexp_**>).
         super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
    std::function<void_(std::tuple<const_char_*,_Sexp_**>)>::operator()(func,&local_58);
  }
  local_38 = (this->vector_roots).
             super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar6 = (this->vector_roots).
                super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar6 != local_38; ptVar6 = ptVar6 + 1)
  {
    pvVar2 = (ptVar6->
             super__Tuple_impl<0UL,_const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>).
             super__Tuple_impl<1UL,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>.
             super__Head_base<1UL,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*,_false>.
             _M_head_impl;
    ppSVar3 = (pvVar2->super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (_Var5._M_head_impl =
              (pvVar2->super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>)._M_impl.
              super__Vector_impl_data._M_start; _Var5._M_head_impl != ppSVar3;
        _Var5._M_head_impl = _Var5._M_head_impl + 1) {
      local_48.super__Tuple_impl<0UL,_const_char_*,_Sexp_**>.
      super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
           (ptVar6->
           super__Tuple_impl<0UL,_const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>).
           super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
      local_48.super__Tuple_impl<0UL,_const_char_*,_Sexp_**>.super__Tuple_impl<1UL,_Sexp_**>.
      super__Head_base<1UL,_Sexp_**,_false>._M_head_impl =
           (_Head_base<1UL,_Sexp_**,_false>)(_Head_base<1UL,_Sexp_**,_false>)_Var5._M_head_impl;
      std::function<void_(std::tuple<const_char_*,_Sexp_**>)>::operator()(func,&local_48);
    }
  }
  return;
}

Assistant:

void
  TracePointers(std::function<void(std::tuple<const char *, Sexp **>)> func) {
    for (auto &it : roots) {
      func(it);
    }

    for (auto &vec : vector_roots) {
      for (auto &root : *std::get<1>(vec)) {
        Sexp **loc = &root;
        func(std::make_tuple(std::get<0>(vec), loc));
      }
    }
  }